

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::StructuredAssignmentPatternSyntax::StructuredAssignmentPatternSyntax
          (StructuredAssignmentPatternSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *items,Token closeBrace)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  AssignmentPatternItemSyntax *pAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = closeBrace._0_8_;
  uVar5 = openBrace._0_8_;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.kind = StructuredAssignmentPattern;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  SVar2 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050be20;
  sVar1 = (items->elements).size_;
  (this->items).elements.data_ = (items->elements).data_;
  (this->items).elements.size_ = sVar1;
  (this->closeBrace).kind = (short)uVar6;
  (this->closeBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBrace).info = closeBrace.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->items).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pAVar4 = SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::operator[]
                         (&this->items,index);
      (pAVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}